

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O3

int ffvcks(fitsfile *fptr,int *datastatus,int *hdustatus,int *status)

{
  int iVar1;
  int iVar2;
  unsigned_long hdusum;
  unsigned_long datasum;
  char chksum [71];
  char comm [73];
  unsigned_long local_e8;
  ulong local_e0;
  double local_d8;
  char local_c8 [80];
  char local_78 [80];
  
  if (0 < *status) {
    return *status;
  }
  *datastatus = -1;
  *hdustatus = -1;
  iVar2 = *status;
  iVar1 = ffgkys(fptr,"CHECKSUM",local_c8,local_78,status);
  if (iVar1 == 0xca) {
    *hdustatus = 0;
    *status = iVar2;
  }
  if (local_c8[0] == '\0') {
    *hdustatus = 0;
  }
  iVar1 = ffgkys(fptr,"DATASUM",local_c8,local_78,status);
  if (iVar1 == 0xca) {
    *datastatus = 0;
    *status = iVar2;
  }
  if (local_c8[0] == '\0') {
    *datastatus = 0;
  }
  iVar2 = *status;
  if ((iVar2 < 1) && ((*hdustatus != 0 || (*datastatus != 0)))) {
    local_d8 = atof(local_c8);
    iVar2 = ffgcks(fptr,&local_e0,&local_e8,status);
    if (iVar2 < 1) {
      if ((*datastatus != 0) &&
         (local_e0 ==
          ((long)(local_d8 - 9.223372036854776e+18) & (long)local_d8 >> 0x3f | (long)local_d8))) {
        *datastatus = 1;
      }
      if ((*hdustatus != 0) && ((local_e8 == 0xffffffff || (local_e8 == 0)))) {
        *hdustatus = 1;
      }
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffvcks(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *datastatus,     /* O - data checksum status               */
           int *hdustatus,      /* O - hdu checksum status                */
                                /*     1  verification is correct         */
                                /*     0  checksum keyword is not present */
                                /*    -1 verification not correct         */
           int *status)         /* IO - error status                      */
/*
    Verify the HDU by comparing the value of the computed checksums against
    the values of the DATASUM and CHECKSUM keywords if they are present.
*/
{
    int tstatus;
    double tdouble;
    unsigned long datasum, hdusum, olddatasum;
    char chksum[FLEN_VALUE], comm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *datastatus = -1;
    *hdustatus  = -1;

    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", chksum, comm, status) == KEY_NO_EXIST)
    {
        *hdustatus = 0;             /* CHECKSUM keyword does not exist */
        *status = tstatus;
    }
    if (chksum[0] == '\0')
        *hdustatus = 0;    /* all blank checksum means it is undefined */

    if (ffgkys(fptr, "DATASUM", chksum, comm, status) == KEY_NO_EXIST)
    {
        *datastatus = 0;            /* DATASUM keyword does not exist */
        *status = tstatus;
    }
    if (chksum[0] == '\0')
        *datastatus = 0;    /* all blank checksum means it is undefined */

    if ( *status > 0 || (!(*hdustatus) && !(*datastatus)) )
        return(*status);            /* return if neither keywords exist */

    /* convert string to unsigned long */

    /* olddatasum = strtoul(chksum, 0, 10);  doesn't work w/ gcc on SUN OS */
    /* sscanf(chksum, "%u", &olddatasum);   doesn't work w/ cc on VAX/VMS */

    tdouble = atof(chksum); /* read as a double as a workaround */
    olddatasum = (unsigned long) tdouble;

    /*  calculate the data checksum and the HDU checksum */
    if (ffgcks(fptr, &datasum, &hdusum, status) > 0)
        return(*status);

    if (*datastatus)
        if (datasum == olddatasum)
            *datastatus = 1;

    if (*hdustatus)
        if (hdusum == 0 || hdusum == 0xFFFFFFFF)
            *hdustatus = 1;

    return(*status);
}